

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalSubscriptMat4(ShaderEvalContext *c)

{
  Vector<float,_4> local_a0;
  Vector<float,_4> local_90;
  Vector<float,_4> local_80;
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  Vector<float,_4> local_30;
  undefined8 local_20;
  undefined8 local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle(&local_60,(int)c,1,2,3);
  tcu::operator*((tcu *)&local_50,0.5,&local_60);
  tcu::operator+((tcu *)&local_40,&c->coords,&local_50);
  tcu::Vector<float,_4>::swizzle(&local_80,(int)local_10,2,3,0);
  tcu::operator*((tcu *)&local_70,0.25,&local_80);
  tcu::operator+((tcu *)&local_30,&local_40,&local_70);
  tcu::Vector<float,_4>::swizzle(&local_a0,(int)local_10,3,0,1);
  tcu::operator*((tcu *)&local_90,0.125,&local_a0);
  tcu::operator+((tcu *)&local_20,&local_30,&local_90);
  *(undefined8 *)(local_10->color).m_data = local_20;
  *(undefined8 *)((local_10->color).m_data + 2) = local_18;
  return;
}

Assistant:

void evalSubscriptMat4		(ShaderEvalContext& c) { c.color		= c.coords + 0.5f*c.coords.swizzle(1,2,3,0) + 0.25f*c.coords.swizzle(2,3,0,1) + 0.125f*c.coords.swizzle(3,0,1,2); }